

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  ImDrawCmd *pIVar7;
  ImGuiContext *pIVar8;
  long lVar9;
  ImVec4 *pIVar10;
  ImDrawCmd *__dest;
  int iVar11;
  int iVar12;
  void *pvVar13;
  
  pIVar8 = GImGui;
  lVar9 = (long)(this->_ClipRectStack).Size;
  pIVar10 = &GNullClipRect;
  if (lVar9 != 0) {
    pIVar10 = (this->_ClipRectStack).Data + lVar9 + -1;
  }
  fVar2 = pIVar10->x;
  fVar3 = pIVar10->z;
  lVar9 = (long)(this->_TextureIdStack).Size;
  if (lVar9 == 0) {
    pvVar13 = (void *)0x0;
  }
  else {
    pvVar13 = (this->_TextureIdStack).Data[lVar9 + -1];
  }
  if (fVar2 <= fVar3) {
    fVar4 = pIVar10->y;
    fVar5 = pIVar10->w;
    if (fVar4 <= fVar5) {
      iVar12 = (this->CmdBuffer).Size;
      iVar6 = (this->CmdBuffer).Capacity;
      if (iVar12 == iVar6) {
        iVar12 = iVar12 + 1;
        if (iVar6 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar6 / 2 + iVar6;
        }
        if (iVar12 < iVar11) {
          iVar12 = iVar11;
        }
        if (iVar6 < iVar12) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          __dest = (ImDrawCmd *)(*(pIVar8->IO).MemAllocFn)((long)iVar12 * 0x30);
          pIVar7 = (this->CmdBuffer).Data;
          if (pIVar7 != (ImDrawCmd *)0x0) {
            memcpy(__dest,pIVar7,(long)(this->CmdBuffer).Size * 0x30);
          }
          pIVar7 = (this->CmdBuffer).Data;
          if (pIVar7 != (ImDrawCmd *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pIVar7);
          (this->CmdBuffer).Data = __dest;
          (this->CmdBuffer).Capacity = iVar12;
        }
      }
      pIVar7 = (this->CmdBuffer).Data;
      iVar12 = (this->CmdBuffer).Size;
      (this->CmdBuffer).Size = iVar12 + 1;
      pIVar7[iVar12].ElemCount = 0;
      pIVar7[iVar12].ClipRect.x = fVar2;
      pIVar7[iVar12].ClipRect.y = fVar4;
      pIVar7[iVar12].ClipRect.z = fVar3;
      pIVar7[iVar12].ClipRect.w = fVar5;
      pIVar7[iVar12].TextureId = pvVar13;
      pIVar7[iVar12].UserCallback = (ImDrawCallback)0x0;
      (&pIVar7[iVar12].UserCallback)[1] = (ImDrawCallback)0x0;
      return;
    }
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                ,0xa8,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}